

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O3

bool __thiscall Process::Converter::checkValue(Converter *this,string *s)

{
  size_t __n;
  pointer __s1;
  pointer pbVar1;
  int iVar2;
  size_t sVar3;
  long *plVar4;
  size_type *psVar5;
  string *v;
  pointer pbVar6;
  string *__range1;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Converter *local_38;
  
  iVar2 = std::__cxx11::string::compare((char *)s);
  if (iVar2 == 0) {
    return true;
  }
  __n = s->_M_string_length;
  if (__n == 0) {
    return true;
  }
  __s1 = (s->_M_dataplus)._M_p;
  sVar3 = 0;
  do {
    if (0x19 < (byte)((__s1[sVar3] & 0xdfU) + 0xbf)) {
      sVar3 = 0;
      goto LAB_00106e6f;
    }
    sVar3 = sVar3 + 1;
  } while (__n != sVar3);
  goto LAB_00106e87;
  while (sVar3 = sVar3 + 1, __n != sVar3) {
LAB_00106e6f:
    if (9 < (byte)(__s1[sVar3] - 0x30U)) {
      std::operator+(&local_58,"The value : ",s);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_78.field_2._M_allocated_capacity = *psVar5;
        local_78.field_2._8_8_ = plVar4[3];
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar5;
        local_78._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_78._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      error(this,&local_78);
      goto LAB_00106fc4;
    }
  }
LAB_00106e87:
  sVar3 = 0;
  while ((byte)(__s1[sVar3] - 0x30U) < 10) {
    sVar3 = sVar3 + 1;
    if (__n == sVar3) {
      return true;
    }
  }
  pbVar1 = (this->_contVar).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  for (pbVar6 = (this->_contVar).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    if ((__n == pbVar6->_M_string_length) &&
       (iVar2 = bcmp(__s1,(pbVar6->_M_dataplus)._M_p,__n), iVar2 == 0)) {
      return true;
    }
  }
  std::operator+(&local_58,"The value : ",s);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78.field_2._8_8_ = plVar4[3];
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar5;
    local_78._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_78._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  error(local_38,&local_78);
LAB_00106fc4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool Converter::checkValue(const std::string &s)
    {
        if (s == "UWUAC")
            return true;
        if (!isChar(s)
        && !isNb(s))
            return error("The value : " + s + " is not handled!");

        if (isNb(s))
            return true;

        for (const std::string &v : _contVar)
            if (s == v)
                return true;
        return error("The value : " + s + " is undefined!");
    }